

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMDocumentImpl::~DOMDocumentImpl(DOMDocumentImpl *this)

{
  DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher> *this_00;
  RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
  *this_01;
  RefArrayOf<xercesc_4_0::RefStackOf<xercesc_4_0::DOMNode>_> *this_02;
  XMemory *this_03;
  DOMNormalizer *this_04;
  DOMDeepNodeListPoolTableBucketElem<xercesc_4_0::DOMDeepNodeListImpl> **in_RSI;
  
  (this->super_DOMMemoryManager)._vptr_DOMMemoryManager =
       (_func_int **)&PTR__DOMDocumentImpl_0040ebb0;
  (this->super_DOMDocument).super_DOMDocumentRange._vptr_DOMDocumentRange =
       (_func_int **)&PTR__DOMDocumentImpl_0040eee8;
  (this->super_DOMDocument).super_DOMXPathEvaluator._vptr_DOMXPathEvaluator =
       (_func_int **)&PTR__DOMDocumentImpl_0040f030;
  (this->super_DOMDocument).super_DOMDocumentTraversal._vptr_DOMDocumentTraversal =
       (_func_int **)&PTR__DOMDocumentImpl_0040f068;
  (this->super_DOMDocument).super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMDocumentImpl_0040f098;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl = (_func_int **)&PTR__DOMDocumentImpl_0040f1e8;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMDocumentImpl_0040f218;
  if (this->fDOMConfiguration != (DOMConfiguration *)0x0) {
    (*this->fDOMConfiguration->_vptr_DOMConfiguration[6])();
  }
  this_00 = this->fNodeListPool;
  if (this_00 !=
      (DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher> *)0x0) {
    DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::removeAll
              (this_00);
    (*this_00->fMemoryManager->_vptr_MemoryManager[4])(this_00->fMemoryManager,this_00->fIdPtrs);
    in_RSI = this_00->fBucketList;
    (*this_00->fMemoryManager->_vptr_MemoryManager[4])();
  }
  if (this->fRanges != (Ranges *)0x0) {
    (*(this->fRanges->super_BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>)._vptr_BaseRefVectorOf[1])();
  }
  if (this->fNodeIterators != (NodeIterators *)0x0) {
    (*(this->fNodeIterators->super_BaseRefVectorOf<xercesc_4_0::DOMNodeIteratorImpl>).
      _vptr_BaseRefVectorOf[1])();
  }
  this_01 = this->fUserDataTable;
  if (this_01 !=
      (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
       *)0x0) {
    RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::~RefHash2KeysTableOf(this_01);
    XMemory::operator_delete((XMemory *)this_01,in_RSI);
  }
  if (this->fRecycleNodePtr != (RefArrayOf<xercesc_4_0::RefStackOf<xercesc_4_0::DOMNode>_> *)0x0) {
    RefArrayOf<xercesc_4_0::RefStackOf<xercesc_4_0::DOMNode>_>::deleteAllElements
              (this->fRecycleNodePtr);
    this_02 = this->fRecycleNodePtr;
    if (this_02 != (RefArrayOf<xercesc_4_0::RefStackOf<xercesc_4_0::DOMNode>_> *)0x0) {
      in_RSI = (DOMDeepNodeListPoolTableBucketElem<xercesc_4_0::DOMDeepNodeListImpl> **)
               this_02->fArray;
      (*this_02->fMemoryManager->_vptr_MemoryManager[4])();
      XMemory::operator_delete((XMemory *)this_02,in_RSI);
    }
  }
  this_03 = (XMemory *)this->fRecycleBufferPtr;
  if (this_03 != (XMemory *)0x0) {
    RefVectorOf<xercesc_4_0::DOMBuffer>::~RefVectorOf
              ((RefVectorOf<xercesc_4_0::DOMBuffer> *)(this_03 + 8));
    XMemory::operator_delete(this_03,in_RSI);
  }
  this_04 = this->fNormalizer;
  if (this_04 != (DOMNormalizer *)0x0) {
    DOMNormalizer::~DOMNormalizer(this_04);
    XMemory::operator_delete((XMemory *)this_04,in_RSI);
  }
  deleteHeap(this);
  XMLStringPool::~XMLStringPool(&this->fUserDataTableKeys);
  DOMParentNode::~DOMParentNode(&this->fParent);
  DOMNodeImpl::~DOMNodeImpl(&this->fNode);
  return;
}

Assistant:

DOMDocumentImpl::~DOMDocumentImpl()
{
    // While DOMConfiguration is allocated on the Document's heap, itself
    // it uses the memory manager directly. This means that while we cannot
    // delete with operator delete, we need to call its d-tor.
    //
    if (fDOMConfiguration)
      fDOMConfiguration->~DOMConfiguration ();

    //  Clean up the fNodeListPool
    if (fNodeListPool)
        fNodeListPool->cleanup();

    if (fRanges)
        delete fRanges; //fRanges->cleanup();

    if (fNodeIterators)
        delete fNodeIterators;//fNodeIterators->cleanup();

    if (fUserDataTable)
        delete fUserDataTable;//fUserDataTable->cleanup();

    if (fRecycleNodePtr) {
        fRecycleNodePtr->deleteAllElements();
        delete fRecycleNodePtr;
    }

    if (fRecycleBufferPtr) {
        delete fRecycleBufferPtr;
    }

    delete fNormalizer;

    //  Delete the heap for this document.  This uncerimoniously yanks the storage
    //      out from under all of the nodes in the document.  Destructors are NOT called.
    this->deleteHeap();
}